

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

SoftmaxLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_softmax(NeuralNetworkLayer *this)

{
  bool bVar1;
  SoftmaxLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_softmax(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_softmax(this);
    this_00 = (SoftmaxLayerParams *)operator_new(0x18);
    SoftmaxLayerParams::SoftmaxLayerParams(this_00);
    (this->layer_).softmax_ = this_00;
  }
  return (SoftmaxLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SoftmaxLayerParams* NeuralNetworkLayer::mutable_softmax() {
  if (!has_softmax()) {
    clear_layer();
    set_has_softmax();
    layer_.softmax_ = new ::CoreML::Specification::SoftmaxLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.softmax)
  return layer_.softmax_;
}